

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspConfig::reset(ClaspConfig *this)

{
  SolveOptions local_88;
  
  if (this->tester_ != (UserConfig *)0x0) {
    (*(this->tester_->super_UserConfiguration).super_Configuration._vptr_Configuration[0xd])();
  }
  Impl::reset(this->impl_);
  BasicSatConfig::reset(&this->super_BasicSatConfig);
  local_88.super_EnumOptions.optStop.ebo_.buf = (pointer)0x0;
  local_88.super_EnumOptions.optStop.ebo_.size = 0;
  local_88.super_EnumOptions.optStop.ebo_.cap = 0;
  local_88.super_EnumOptions.optBound.ebo_.buf = (pointer)0x0;
  local_88.super_EnumOptions.optBound.ebo_.size = 0;
  local_88.super_EnumOptions.optBound.ebo_.cap = 0;
  local_88.super_EnumOptions.enumMode = enum_auto;
  local_88.super_EnumOptions.optMode = ignore;
  local_88.super_EnumOptions.proMode = Implicit;
  local_88.super_EnumOptions.project = 0;
  local_88.super_ParallelSolveOptions.algorithm.threads = 0;
  local_88.super_ParallelSolveOptions.algorithm.mode = mode_split;
  local_88.super_EnumOptions.numModels = 0;
  local_88.super_ParallelSolveOptions.restarts.sched._0_4_ = 0;
  local_88.super_ParallelSolveOptions.restarts.sched.idx = 0;
  local_88.super_ParallelSolveOptions.restarts.sched.len = 0;
  local_88.super_ParallelSolveOptions.restarts.sched.grow = 0.0;
  local_88.super_ParallelSolveOptions.integrate = (Integration)0x0;
  local_88.super_ParallelSolveOptions.distribute.super_Policy = (Policy)0x0;
  local_88.super_ParallelSolveOptions.distribute.mode = 0;
  local_88.super_ParallelSolveOptions.restarts.maxR = 0;
  local_88.super_ParallelSolveOptions.super_BasicSolveOptions.limit.conflicts = 0;
  local_88.super_ParallelSolveOptions.super_BasicSolveOptions.limit.restarts = 0;
  SolveOptions::SolveOptions(&local_88);
  SolveOptions::operator=(&this->solve,&local_88);
  EnumOptions::~EnumOptions(&local_88.super_EnumOptions);
  this->asp = (AspOptions)0x500000000;
  return;
}

Assistant:

void ClaspConfig::reset() {
	if (tester_) { tester_->reset(); }
	impl_->reset();
	BasicSatConfig::reset();
	solve = SolveOptions();
	asp   = AspOptions();
}